

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O1

void GraphTask::takedown(search *sch,multi_ex *param_2)

{
  void *pvVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  pvVar1 = sch->task_data;
  if (*(long *)((long)pvVar1 + 0x68) != *(long *)((long)pvVar1 + 0x60)) {
    *(long *)((long)pvVar1 + 0x68) = *(long *)((long)pvVar1 + 0x60);
  }
  if (*(long *)((long)pvVar1 + 0x80) != *(long *)((long)pvVar1 + 0x78)) {
    *(long *)((long)pvVar1 + 0x80) = *(long *)((long)pvVar1 + 0x78);
  }
  pvVar2 = *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)((long)pvVar1 + 0x50);
  for (__x = *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)((long)pvVar1 + 0x48);
      __x != pvVar2; __x = __x + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__x);
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)((long)pvVar1 + 0x48));
  return;
}

Assistant:

T* get_task_data()
  {
    return (T*)task_data;
  }